

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::validationCheckerTemplate::validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  context_t *pcVar4;
  validationChecker *local_20;
  
  this->enableValidationCheckerTemplate = false;
  bVar1 = getenv_tobool("ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE");
  this->enableValidationCheckerTemplate = bVar1;
  if (bVar1) {
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = &PTR_zeInitPrologue_001d9270;
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = &PTR_zesInitPrologue_001d9f58;
    DAT_001dc740 = (undefined8 *)operator_new(8);
    *DAT_001dc740 = &PTR_zetModuleGetDebugInfoPrologue_001da8e0;
    templateChecker = puVar2;
    DAT_001dc738 = puVar3;
    pcVar4 = context_t::getInstance();
    local_20 = (validationChecker *)&templateChecker;
    std::
    vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
    ::emplace_back<validation_layer::validationChecker*>
              ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                *)&pcVar4->validationHandlers,&local_20);
  }
  return;
}

Assistant:

validationCheckerTemplate::validationCheckerTemplate() {
        enableValidationCheckerTemplate = getenv_tobool( "ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE" );
        if(enableValidationCheckerTemplate) {
            validationCheckerTemplate::ZEvalidationCheckerTemplate *zeChecker = new validationCheckerTemplate::ZEvalidationCheckerTemplate;
            validationCheckerTemplate::ZESvalidationCheckerTemplate *zesChecker = new validationCheckerTemplate::ZESvalidationCheckerTemplate;
            validationCheckerTemplate::ZETvalidationCheckerTemplate *zetChecker = new validationCheckerTemplate::ZETvalidationCheckerTemplate;
            templateChecker.zeValidation = zeChecker;
            templateChecker.zetValidation = zetChecker;
            templateChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&templateChecker);
        }
    }